

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

void __thiscall CGL::Matrix3x3::operator/=(Matrix3x3 *this,double x)

{
  double dVar1;
  double dVar2;
  
  dVar2 = 1.0 / x;
  dVar1 = this->entries[0].field_0.field_0.y;
  this->entries[0].field_0.field_0.x = dVar2 * this->entries[0].field_0.field_0.x;
  this->entries[0].field_0.field_0.y = dVar2 * dVar1;
  this->entries[0].field_0.field_0.z = dVar2 * this->entries[0].field_0.field_0.z;
  dVar1 = this->entries[1].field_0.field_0.y;
  this->entries[1].field_0.field_0.x = dVar2 * this->entries[1].field_0.field_0.x;
  this->entries[1].field_0.field_0.y = dVar2 * dVar1;
  this->entries[1].field_0.field_0.z = dVar2 * this->entries[1].field_0.field_0.z;
  dVar1 = this->entries[2].field_0.field_0.y;
  this->entries[2].field_0.field_0.x = dVar2 * this->entries[2].field_0.field_0.x;
  this->entries[2].field_0.field_0.y = dVar2 * dVar1;
  this->entries[2].field_0.field_0.z = dVar2 * this->entries[2].field_0.field_0.z;
  return;
}

Assistant:

void Matrix3x3::operator/=( double x ) {
    Matrix3x3& A( *this );
    double rx = 1./x;

    A[0] *= rx;
    A[1] *= rx;
    A[2] *= rx;
  }